

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O3

void __thiscall
btMatrixX<float>::multiplyAdd2_p8r
          (btMatrixX<float> *this,btScalar *B,btScalar *C,int numRows,int numRowsOther,int row,
          int col)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  float fVar7;
  
  if (0 < numRows) {
    iVar4 = this->m_setElemOperations;
    iVar5 = 0;
    do {
      if (0 < numRowsOther) {
        pfVar2 = (this->m_storage).m_data;
        lVar3 = (long)(this->m_cols * row) * 4 + (long)col * 4;
        lVar6 = 0;
        do {
          fVar7 = B[6] * C[lVar6 * 2 + 6] +
                  B[5] * C[lVar6 * 2 + 5] +
                  B[4] * C[lVar6 * 2 + 4] +
                  B[2] * C[lVar6 * 2 + 2] + B[1] * C[lVar6 * 2 + 1] + *B * C[lVar6 * 2];
          if ((fVar7 != 0.0) || (NAN(fVar7))) {
            fVar1 = *(float *)((long)pfVar2 + lVar6 + lVar3);
            if ((fVar1 != 0.0) || (NAN(fVar1))) {
              fVar7 = fVar7 + fVar1;
            }
            else {
              iVar4 = iVar4 + 1;
              this->m_setElemOperations = iVar4;
            }
            *(float *)((long)pfVar2 + lVar6 + lVar3) = fVar7;
          }
          lVar6 = lVar6 + 4;
        } while ((ulong)(uint)numRowsOther << 2 != lVar6);
      }
      B = B + 8;
      iVar5 = iVar5 + 1;
      row = row + 1;
    } while (iVar5 != numRows);
  }
  return;
}

Assistant:

void multiplyAdd2_p8r (const btScalar *B, const btScalar *C,  int numRows,  int numRowsOther ,int row, int col)
	{
		const btScalar *bb = B;
		for ( int i = 0;i<numRows;i++)
		{
			const btScalar *cc = C;
			for ( int j = 0;j<numRowsOther;j++)
			{
				btScalar sum;
				sum  = bb[0]*cc[0];
				sum += bb[1]*cc[1];
				sum += bb[2]*cc[2];
				sum += bb[4]*cc[4];
				sum += bb[5]*cc[5];
				sum += bb[6]*cc[6];
				addElem(row+i,col+j,sum);
				cc += 8;
			}
			bb += 8;
		}
	}